

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_queue.c
# Opt level: O2

ItemQueue * ItemQueue_new_array(int size)

{
  undefined8 *puVar1;
  ItemQueue *pIVar2;
  ulong uVar3;
  ulong uVar4;
  
  pIVar2 = (ItemQueue *)malloc((long)size << 4);
  uVar3 = 0;
  uVar4 = (ulong)(uint)size;
  if (size < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    puVar1 = (undefined8 *)((long)&pIVar2->first + uVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
  }
  return pIVar2;
}

Assistant:

ItemQueue* ItemQueue_new_array(int size) {
    ItemQueue* item_queues = (ItemQueue*)malloc(size * sizeof(ItemQueue));
    int i;
    for (i = 0; i < size; ++i) {
        item_queues[i].first = 0;
        item_queues[i].last = 0;
    }
    return item_queues;
}